

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O1

JoypadStateIter joypad_find_state(JoypadBuffer *buffer,Ticks ticks)

{
  size_t sVar1;
  JoypadState *pJVar2;
  JoypadChunk *chunk;
  JoypadChunk *pJVar3;
  JoypadChunk *pJVar4;
  JoypadState *end_;
  JoypadState *pJVar5;
  JoypadState *pJVar6;
  JoypadState *pJVar7;
  ulong uVar8;
  JoypadStateIter JVar9;
  
  pJVar4 = (buffer->sentinel).next;
  if (pJVar4->size != 0) {
    pJVar3 = (buffer->sentinel).prev;
    sVar1 = pJVar3->size;
    if (sVar1 != 0) {
      pJVar7 = pJVar4->data;
      if (pJVar7->ticks <= ticks && ticks != pJVar7->ticks) {
        uVar8 = pJVar3->data[sVar1 - 1].ticks;
        if (ticks < uVar8) {
          if (ticks - pJVar7->ticks < uVar8 - ticks) {
            uVar8 = pJVar4->data[pJVar4->size - 1].ticks;
            pJVar3 = pJVar4;
            while (uVar8 <= ticks) {
              pJVar3 = pJVar3->next;
              uVar8 = pJVar3->data[pJVar3->size - 1].ticks;
            }
          }
          else {
            while (ticks < pJVar3->data->ticks) {
              pJVar3 = pJVar3->prev;
            }
          }
          if (pJVar3->size == 0) {
            pJVar7 = (JoypadState *)0x0;
          }
          else {
            pJVar6 = pJVar3->data;
            pJVar5 = pJVar6 + pJVar3->size;
            do {
              uVar8 = (long)pJVar5 - (long)pJVar6 >> 4;
              pJVar7 = pJVar6;
              if ((long)uVar8 < 2) break;
              pJVar7 = (JoypadState *)(pJVar6->padding + (uVar8 & 0xfffffffffffffffe) * 8 + -9);
              pJVar2 = pJVar7;
              if (ticks < pJVar7->ticks) {
                pJVar5 = pJVar7;
                pJVar2 = pJVar6;
              }
              pJVar6 = pJVar2;
            } while (pJVar7->ticks != ticks);
          }
          if (pJVar7 == (JoypadState *)0x0) {
            __assert_fail("lower_bound != NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                          ,0x85,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
          }
          pJVar4 = pJVar3;
          if (ticks < pJVar7->ticks) {
            __assert_fail("result.state->ticks <= ticks",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                          ,0x88,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
          }
        }
        else {
          pJVar7 = pJVar3->data + (sVar1 - 1);
          pJVar4 = pJVar3;
        }
      }
      JVar9.state = pJVar7;
      JVar9.chunk = pJVar4;
      return JVar9;
    }
  }
  __assert_fail("first_chunk->size != 0 && last_chunk->size != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",0x65
                ,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
}

Assistant:

JoypadStateIter joypad_find_state(JoypadBuffer* buffer, Ticks ticks) {
  /* TODO(binji): Use a skip list if this is too slow? */
  JoypadStateIter result;
  JoypadChunk* first_chunk = buffer->sentinel.next;
  JoypadChunk* last_chunk = buffer->sentinel.prev;
  assert(first_chunk->size != 0 && last_chunk->size != 0);
  Ticks first_ticks = first_chunk->data[0].ticks;
  Ticks last_ticks = last_chunk->data[last_chunk->size - 1].ticks;
  if (ticks <= first_ticks) {
    /* At or past the beginning. */
    result.chunk = first_chunk;
    result.state = &first_chunk->data[0];
    return result;
  } else if (ticks >= last_ticks) {
    /* At or past the end. */
    result.chunk = last_chunk;
    result.state = &last_chunk->data[last_chunk->size - 1];
    return result;
  } else if (ticks - first_ticks < last_ticks - ticks) {
    /* Closer to the beginning. */
    JoypadChunk* chunk = first_chunk;
    while (ticks >= chunk->data[chunk->size - 1].ticks) {
      chunk = chunk->next;
    }
    result.chunk = chunk;
  } else {
    /* Closer to the end. */
    JoypadChunk* chunk = last_chunk;
    while (ticks < chunk->data[0].ticks) {
      chunk = chunk->prev;
    }
    result.chunk = chunk;
  }

  JoypadState* begin = result.chunk->data;
  JoypadState* end = begin + result.chunk->size;
  LOWER_BOUND(JoypadState, lower_bound, begin, end, ticks, GET_TICKS, CMP_LT);
  assert(lower_bound != NULL); /* The chunk should not be empty. */

  result.state = lower_bound;
  assert(result.state->ticks <= ticks);
  return result;
}